

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_functions_to_test.hpp
# Opt level: O3

void duckdb::udf_ternary_function<char*>(DataChunk *input,ExpressionState *state,Vector *result)

{
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  reference pvVar4;
  reference vector;
  ulong uVar5;
  void *pvVar6;
  void *__src;
  undefined1 *__dest;
  undefined4 *puVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  string_t target;
  undefined1 local_48 [16];
  Vector *local_38;
  
  duckdb::DataChunk::Flatten();
  duckdb::Vector::SetVectorType((VectorType)result);
  puVar7 = *(undefined4 **)(result + 0x20);
  pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,2);
  lVar2 = *(long *)(pvVar4 + 0x20);
  pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,0);
  FlatVector::VerifyFlatVector(pvVar4);
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,2);
  FlatVector::VerifyFlatVector(vector);
  FlatVector::VerifyFlatVector(result);
  *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30),
             (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(vector + 0x30));
  *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
  uVar5 = *(ulong *)(input + 0x18);
  if (uVar5 != 0) {
    pvVar6 = (void *)(lVar2 + 4);
    uVar8 = 0;
    local_38 = result;
    do {
      if ((*(long *)(pvVar4 + 0x28) == 0) ||
         ((*(ulong *)(*(long *)(pvVar4 + 0x28) + (uVar8 >> 6) * 8) >> (uVar8 & 0x3f) & 1) != 0)) {
        uVar1 = *(uint *)((long)pvVar6 + -4);
        auVar9 = duckdb::StringVector::EmptyString(local_38,(ulong)uVar1);
        __dest = local_48 + 4;
        if (0xc < auVar9._0_4_) {
          __dest = auVar9._8_8_;
        }
        __src = pvVar6;
        if (0xc < *(uint *)((long)pvVar6 + -4)) {
          __src = *(void **)((long)pvVar6 + 4);
        }
        local_48 = auVar9;
        memcpy(__dest,__src,(ulong)uVar1);
        uVar3 = local_48._0_8_;
        uVar5 = uVar3 & 0xffffffff;
        if (uVar5 < 0xd) {
          memset(local_48 + uVar5 + 4,0,0xc - uVar5);
        }
        else {
          local_48._4_4_ = *(undefined4 *)local_48._8_8_;
        }
        *puVar7 = local_48._0_4_;
        puVar7[1] = local_48._4_4_;
        *(undefined8 *)(puVar7 + 2) = local_48._8_8_;
        uVar5 = *(ulong *)(input + 0x18);
      }
      uVar8 = uVar8 + 1;
      puVar7 = puVar7 + 4;
      pvVar6 = (void *)((long)pvVar6 + 0x10);
    } while (uVar8 < uVar5);
  }
  return;
}

Assistant:

static void udf_ternary_function(DataChunk &input, ExpressionState &state, Vector &result) {
	input.Flatten();
	switch (GetTypeId<TYPE>()) {
	case PhysicalType::VARCHAR: {
		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<string_t>(result);
		auto ldata = FlatVector::GetData<string_t>(input.data[2]);
		auto &validity = FlatVector::Validity(input.data[0]);

		FlatVector::SetValidity(result, FlatVector::Validity(input.data[2]));

		for (idx_t i = 0; i < input.size(); i++) {
			if (!validity.RowIsValid(i)) {
				continue;
			}
			auto input_length = ldata[i].GetSize();
			string_t target = StringVector::EmptyString(result, input_length);
			auto target_data = target.GetDataWriteable();
			memcpy(target_data, ldata[i].GetData(), input_length);
			target.Finalize();
			result_data[i] = target;
		}
		break;
	}
	default: {
		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<TYPE>(result);
		auto ldata = FlatVector::GetData<TYPE>(input.data[2]);
		auto &mask = FlatVector::Validity(input.data[2]);
		FlatVector::SetValidity(result, mask);

		for (idx_t i = 0; i < input.size(); i++) {
			if (!mask.RowIsValid(i)) {
				continue;
			}
			result_data[i] = ldata[i];
		}
	}
	}
}